

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::String(String *this)

{
  uchar *puVar1;
  
  (this->super_tagbstring).mlen = 8;
  (this->super_tagbstring).slen = 0;
  puVar1 = (uchar *)malloc(8);
  (this->super_tagbstring).data = puVar1;
  if (puVar1 == (uchar *)0x0) {
    Bstrlib::String((Bstrlib *)this);
  }
  else {
    *puVar1 = '\0';
  }
  return;
}

Assistant:

String::String()
    {
        slen = 0; mlen = 8;
        data = (unsigned char*)malloc(mlen);
        if (!data)
        {
            mlen = 0;
            bstringThrow("Failure in default constructor");
        }
        else data[0] = '\0';
    }